

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

void swrenderer::R_DeinitPlanes(void)

{
  undefined8 *puVar1;
  int i;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  
  fakeActive = 0;
  lVar2 = 0;
  puVar3 = (undefined8 *)freehead;
  do {
    *puVar3 = (&visplanes)[lVar2];
    (&visplanes)[lVar2] = 0;
    puVar1 = (undefined8 *)*puVar3;
    while (puVar4 = puVar1, puVar4 != (undefined8 *)0x0) {
      puVar3 = puVar4;
      freehead = (undefined *)puVar4;
      puVar1 = (undefined8 *)*puVar4;
    }
    lVar2 = lVar2 + 1;
    puVar1 = freetail;
  } while (lVar2 != 0x81);
  while (puVar1 != (undefined8 *)0x0) {
    puVar3 = (undefined8 *)*puVar1;
    free(puVar1);
    puVar1 = puVar3;
  }
  return;
}

Assistant:

void R_DeinitPlanes ()
{
	fakeActive = 0;

	// do not use R_ClearPlanes because at this point the screen pointer is no longer valid.
	for (int i = 0; i <= MAXVISPLANES; i++)	// new code -- killough
	{
		for (*freehead = visplanes[i], visplanes[i] = NULL; *freehead; )
		{
			freehead = &(*freehead)->next;
		}
	}
	for (visplane_t *pl = freetail; pl != NULL; )
	{
		visplane_t *next = pl->next;
		free (pl);
		pl = next;
	}
}